

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O0

UString * __thiscall
jsonnet::internal::(anonymous_namespace)::Interpreter::toString_abi_cxx11_
          (Interpreter *this,LocationRange *loc)

{
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *in_RDI;
  UString *in_stack_00000340;
  undefined1 in_stack_0000034f;
  LocationRange *in_stack_00000350;
  Interpreter *in_stack_00000358;
  allocator<char32_t> *in_stack_ffffffffffffffc0;
  char32_t *in_stack_ffffffffffffffc8;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>
  *in_stack_ffffffffffffffd0;
  
  std::allocator<char32_t>::allocator((allocator<char32_t> *)0x24c8e2);
  std::__cxx11::u32string::u32string<std::allocator<char32_t>>
            (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  anon_unknown_0::Interpreter::manifestJson
            (in_stack_00000358,in_stack_00000350,(bool)in_stack_0000034f,in_stack_00000340);
  std::__cxx11::u32string::~u32string(in_RDI);
  std::allocator<char32_t>::~allocator((allocator<char32_t> *)0x24c92a);
  return in_RDI;
}

Assistant:

UString toString(const LocationRange &loc)
    {
        return manifestJson(loc, false, U"");
    }